

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::Initialize
          (SingleFileBlockManager *this,DatabaseHeader *header,optional_idx block_alloc_size)

{
  optional_idx *this_00;
  long lVar1;
  idx_t iVar2;
  InvalidInputException *pIVar3;
  StorageManager *this_01;
  ulong uVar4;
  allocator local_d9;
  idx_t local_d8;
  optional_idx block_alloc_size_local;
  string local_c8;
  ulong local_a8;
  optional_idx local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->free_list_id = header->free_list;
  this->meta_block = header->meta_block;
  this->iteration_count = header->iteration;
  local_d8 = block_alloc_size.index;
  block_alloc_size_local = block_alloc_size;
  lVar1 = NumericCastImpl<long,_unsigned_long,_false>::Convert(header->block_count);
  this->max_block = lVar1;
  this_00 = &(this->options).storage_version;
  if ((this->options).storage_version.index == 0xffffffffffffffff) {
    optional_idx::optional_idx((optional_idx *)&local_c8,header->serialization_compatibility);
    this_00->index = (idx_t)local_c8._M_dataplus._M_p;
    uVar4 = header->serialization_compatibility;
  }
  else {
    iVar2 = optional_idx::GetIndex(this_00);
    uVar4 = header->serialization_compatibility;
    if (iVar2 < uVar4) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_c8,
                 "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what the database itself uses (%d). The storage version of an existing database cannot be lowered."
                 ,&local_d9);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&this->path);
      InvalidInputException::InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                (pIVar3,&local_c8,&local_50,iVar2,header->serialization_compatibility);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  SerializationCompatibility::Latest();
  ::std::__cxx11::string::~string((string *)&local_c8);
  if (uVar4 <= local_a8) {
    this_01 = AttachedDatabase::GetStorageManager(this->db);
    iVar2 = optional_idx::GetIndex(this_00);
    StorageManager::SetStorageVersion(this_01,iVar2);
    if (local_d8 == 0xffffffffffffffff) {
      iVar2 = header->block_alloc_size;
    }
    else {
      iVar2 = optional_idx::GetIndex(&block_alloc_size_local);
      if (iVar2 != header->block_alloc_size) {
        pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_c8,
                   "Error opening \"%s\": cannot initialize the same database with a different block size: provided block size: %llu, file block size: %llu"
                   ,&local_d9);
        ::std::__cxx11::string::string((string *)&local_90,(string *)&this->path);
        iVar2 = optional_idx::GetIndex(&(this->super_BlockManager).block_alloc_size);
        InvalidInputException::
        InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
                  (pIVar3,&local_c8,&local_90,iVar2,header->block_alloc_size);
        __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    optional_idx::optional_idx(&local_98,iVar2);
    BlockManager::SetBlockAllocSize(&this->super_BlockManager,local_98);
    return;
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_c8,
             "Error opening \"%s\": file was written with a storage version greater than the latest version supported by this DuckDB instance. Try opening the file with a newer version of DuckDB."
             ,&local_d9);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&this->path);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_c8,&local_70);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::Initialize(const DatabaseHeader &header, const optional_idx block_alloc_size) {
	free_list_id = header.free_list;
	meta_block = header.meta_block;
	iteration_count = header.iteration;
	max_block = NumericCast<block_id_t>(header.block_count);
	if (options.storage_version.IsValid()) {
		// storage version specified explicity - use requested storage version
		auto requested_compat_version = options.storage_version.GetIndex();
		if (requested_compat_version < header.serialization_compatibility) {
			throw InvalidInputException(
			    "Error opening \"%s\": cannot initialize database with storage version %d - which is lower than what "
			    "the database itself uses (%d). The storage version of an existing database cannot be lowered.",
			    path, requested_compat_version, header.serialization_compatibility);
		}
	} else {
		// load storage version from header
		options.storage_version = header.serialization_compatibility;
	}
	if (header.serialization_compatibility > SerializationCompatibility::Latest().serialization_version) {
		throw InvalidInputException(
		    "Error opening \"%s\": file was written with a storage version greater than the latest version supported "
		    "by this DuckDB instance. Try opening the file with a newer version of DuckDB.",
		    path);
	}

	db.GetStorageManager().SetStorageVersion(options.storage_version.GetIndex());

	if (block_alloc_size.IsValid() && block_alloc_size.GetIndex() != header.block_alloc_size) {
		throw InvalidInputException(
		    "Error opening \"%s\": cannot initialize the same database with a different block size: provided block "
		    "size: %llu, file block size: %llu",
		    path, GetBlockAllocSize(), header.block_alloc_size);
	}

	SetBlockAllocSize(header.block_alloc_size);
}